

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O2

void __thiscall EOClient::Execute(EOClient *this,string *data)

{
  _List_node_base *p_Var1;
  EOServer *pEVar2;
  bool bVar3;
  PacketFamily PVar4;
  PacketAction PVar5;
  byte bVar6;
  unsigned_short uVar7;
  mapped_type *pmVar8;
  uint uVar9;
  uint uVar10;
  IPAddress local_6c;
  string local_68;
  PacketReader reader;
  
  if (data->_M_string_length < 2) {
    return;
  }
  bVar3 = Client::Connected(&this->super_Client);
  if (!bVar3) {
    return;
  }
  PacketProcessor::Decode(&local_68,&this->processor,data);
  PacketReader::PacketReader(&reader,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if ((((this->super_Client).accepted == false) &&
      (PVar4 = PacketReader::Family(&reader), PVar4 != PACKET_CONNECTION)) &&
     (PVar4 != PACKET_F_INIT)) {
    if ((PVar4 == PACKET_PLAYERS) && (PVar5 = PacketReader::Action(&reader), PVar5 == PACKET_LIST))
    {
      p_Var1 = (this->super_Client).server[1].clients.
               super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
               super__List_node_base._M_prev;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"AllowStats",(allocator<char> *)&local_6c);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&p_Var1[0x19]._M_prev,&local_68);
      bVar3 = util::variant::GetBool(pmVar8);
      std::__cxx11::string::~string((string *)&local_68);
      if (bVar3) goto LAB_00126992;
    }
    pEVar2 = (EOServer *)(this->super_Client).server;
    local_68._M_dataplus._M_p._0_4_ = Client::GetRemoteAddr(&this->super_Client);
    EOServer::RecordClientRejection(pEVar2,(IPAddress *)&local_68,"bad packet");
    Client::Close(&this->super_Client,true);
  }
  else {
LAB_00126992:
    PVar4 = PacketReader::Family(&reader);
    if (PVar4 == PACKET_INTERNAL) {
      local_6c = Client::GetRemoteAddr(&this->super_Client);
      IPAddress::operator_cast_to_string(&local_68,&local_6c);
      Console::Wrn("Closing client connection sending a reserved packet ID: %s");
      std::__cxx11::string::~string((string *)&local_68);
      Client::Close(&this->super_Client,false);
    }
    else {
      PVar4 = PacketReader::Family(&reader);
      if (PVar4 == PACKET_F_INIT) {
        this->seq = (this->seq + 1) % 10;
      }
      else {
        PVar4 = PacketReader::Family(&reader);
        if ((PVar4 == PACKET_CONNECTION) &&
           (PVar5 = PacketReader::Action(&reader), PVar5 == PACKET_PING)) {
          this->seq_start = this->upcoming_seq_start;
        }
        uVar9 = this->seq_start + this->seq;
        this->seq = (this->seq + 1) % 10;
        if ((int)uVar9 < 0xfd) {
          bVar6 = PacketReader::GetChar(&reader);
          uVar10 = (uint)bVar6;
        }
        else {
          uVar7 = PacketReader::GetShort(&reader);
          uVar10 = (uint)uVar7;
        }
        p_Var1 = (this->super_Client).server[1].clients.
                 super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                 super__List_node_base._M_prev;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"EnforceSequence",(allocator<char> *)&local_6c);
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&p_Var1[0x19]._M_prev,&local_68);
        bVar3 = util::variant::GetBool(pmVar8);
        std::__cxx11::string::~string((string *)&local_68);
        if (bVar3 && uVar10 != uVar9) {
          bVar3 = (this->super_Client).accepted;
          if (bVar3 == true) {
            local_6c = Client::GetRemoteAddr(&this->super_Client);
            IPAddress::operator_cast_to_string(&local_68,&local_6c);
            Console::Wrn("Closing client connection sending invalid sequence: %s, Got %i, expected %i."
                         ,CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_),
                         (ulong)uVar10,(ulong)uVar9);
            std::__cxx11::string::~string((string *)&local_68);
          }
          else {
            pEVar2 = (EOServer *)(this->super_Client).server;
            local_68._M_dataplus._M_p._0_4_ = Client::GetRemoteAddr(&this->super_Client);
            EOServer::RecordClientRejection(pEVar2,(IPAddress *)&local_68,"bad sequence");
          }
          Client::Close(&this->super_Client,(bool)(bVar3 ^ 1));
          goto LAB_00126c2f;
        }
      }
      ActionQueue::AddAction(&this->queue,&reader,0.02,true);
    }
  }
LAB_00126c2f:
  PacketReader::~PacketReader(&reader);
  return;
}

Assistant:

void EOClient::Execute(const std::string &data)
{
	if (data.length() < 2)
		return;

	if (!this->Connected())
		return;

	PacketReader reader(processor.Decode(data));

	if (!this->accepted)
	{
		PacketFamily family = reader.Family();

		if (family != PACKET_F_INIT && family != PACKET_CONNECTION
		 && !(family == PACKET_PLAYERS && reader.Action() == PACKET_LIST && this->server()->world->config["AllowStats"]))
		{
			this->server()->RecordClientRejection(this->GetRemoteAddr(), "bad packet");
			this->Close(true);
			return;
		}
	}

	if (reader.Family() == PACKET_INTERNAL)
	{
		Console::Wrn("Closing client connection sending a reserved packet ID: %s", static_cast<std::string>(this->GetRemoteAddr()).c_str());
		this->Close();
		return;
	}

	if (reader.Family() != PACKET_F_INIT)
	{
		bool ping_reply = (reader.Family() == PACKET_CONNECTION && reader.Action() == PACKET_PING);

		if (ping_reply)
			this->PongNewSequence();

		int client_seq;
		int server_seq = this->GenSequence();

		if (server_seq >= 253)
			client_seq = reader.GetShort();
		else
			client_seq = reader.GetChar();

		if (this->server()->world->config["EnforceSequence"])
		{
			if (client_seq != server_seq)
			{
				if (this->accepted)
				{
					Console::Wrn("Closing client connection sending invalid sequence: %s, Got %i, expected %i.", static_cast<std::string>(this->GetRemoteAddr()).c_str(), client_seq, server_seq);
					this->Close();
					return;
				}
				else
				{
					this->server()->RecordClientRejection(this->GetRemoteAddr(), "bad sequence");
					this->Close(true);
					return;
				}
			}
		}
	}
	else
	{
		this->GenSequence();
	}

	queue.AddAction(reader, 0.02, true);
}